

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O3

void ihevc_intra_pred_ref_filtering_sse42
               (UWORD8 *pu1_src,WORD32 nt,UWORD8 *pu1_dst,WORD32 mode,
               WORD32 strong_intra_smoothing_enable_flag)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  ulong uVar40;
  byte *pbVar41;
  byte bVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  int iVar47;
  undefined1 in_XMM0 [16];
  undefined1 auVar48 [16];
  ushort uVar49;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  undefined1 in_XMM1 [16];
  undefined1 auVar50 [16];
  ushort uVar57;
  ushort uVar58;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  undefined1 in_XMM2 [16];
  undefined1 auVar59 [16];
  ushort uVar66;
  undefined1 in_XMM3 [16];
  undefined1 auVar67 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar68 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar69 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  long lVar74;
  undefined1 auVar75 [16];
  long lVar89;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  byte local_138;
  undefined1 uStack_137;
  char acStack_136 [6];
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  byte local_f8;
  undefined7 uStack_f7;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  
  uVar40 = (long)nt * 4;
  iVar38 = 0;
  if (nt != 0) {
    for (; ((uint)nt >> iVar38 & 1) == 0; iVar38 = iVar38 + 1) {
    }
  }
  uVar45 = 1 << ((char)iVar38 - 2U & 0x1f);
  if (nt == 0) {
    uVar45 = 0;
  }
  if ((uVar45 & "\x0e"[mode]) == 0) {
    if (pu1_src == pu1_dst) {
      return;
    }
    switch(nt << 0x1e | nt - 4U >> 2) {
    case 0:
      uVar18 = *(undefined8 *)(pu1_src + 8);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar18;
      break;
    case 1:
      uVar18 = *(undefined8 *)(pu1_src + 8);
      uVar19 = *(undefined8 *)(pu1_src + 0x10);
      uVar20 = *(undefined8 *)(pu1_src + 0x18);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar18;
      *(undefined8 *)(pu1_dst + 0x10) = uVar19;
      *(undefined8 *)(pu1_dst + 0x18) = uVar20;
      break;
    default:
      goto switchD_0014f804_caseD_2;
    case 3:
      uVar18 = *(undefined8 *)(pu1_src + 8);
      uVar19 = *(undefined8 *)(pu1_src + 0x10);
      uVar20 = *(undefined8 *)(pu1_src + 0x18);
      uVar21 = *(undefined8 *)(pu1_src + 0x20);
      uVar22 = *(undefined8 *)(pu1_src + 0x28);
      uVar23 = *(undefined8 *)(pu1_src + 0x30);
      uVar24 = *(undefined8 *)(pu1_src + 0x38);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar18;
      *(undefined8 *)(pu1_dst + 0x10) = uVar19;
      *(undefined8 *)(pu1_dst + 0x18) = uVar20;
      *(undefined8 *)(pu1_dst + 0x20) = uVar21;
      *(undefined8 *)(pu1_dst + 0x28) = uVar22;
      *(undefined8 *)(pu1_dst + 0x30) = uVar23;
      *(undefined8 *)(pu1_dst + 0x38) = uVar24;
      break;
    case 7:
      uVar18 = *(undefined8 *)(pu1_src + 8);
      uVar19 = *(undefined8 *)(pu1_src + 0x10);
      uVar20 = *(undefined8 *)(pu1_src + 0x18);
      uVar21 = *(undefined8 *)(pu1_src + 0x20);
      uVar22 = *(undefined8 *)(pu1_src + 0x28);
      uVar23 = *(undefined8 *)(pu1_src + 0x30);
      uVar24 = *(undefined8 *)(pu1_src + 0x38);
      uVar25 = *(undefined8 *)(pu1_src + 0x40);
      uVar26 = *(undefined8 *)(pu1_src + 0x48);
      uVar27 = *(undefined8 *)(pu1_src + 0x50);
      uVar28 = *(undefined8 *)(pu1_src + 0x58);
      uVar29 = *(undefined8 *)(pu1_src + 0x60);
      uVar30 = *(undefined8 *)(pu1_src + 0x68);
      uVar31 = *(undefined8 *)(pu1_src + 0x70);
      uVar32 = *(undefined8 *)(pu1_src + 0x78);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar18;
      *(undefined8 *)(pu1_dst + 0x10) = uVar19;
      *(undefined8 *)(pu1_dst + 0x18) = uVar20;
      *(undefined8 *)(pu1_dst + 0x20) = uVar21;
      *(undefined8 *)(pu1_dst + 0x28) = uVar22;
      *(undefined8 *)(pu1_dst + 0x30) = uVar23;
      *(undefined8 *)(pu1_dst + 0x38) = uVar24;
      *(undefined8 *)(pu1_dst + 0x40) = uVar25;
      *(undefined8 *)(pu1_dst + 0x48) = uVar26;
      *(undefined8 *)(pu1_dst + 0x50) = uVar27;
      *(undefined8 *)(pu1_dst + 0x58) = uVar28;
      *(undefined8 *)(pu1_dst + 0x60) = uVar29;
      *(undefined8 *)(pu1_dst + 0x68) = uVar30;
      *(undefined8 *)(pu1_dst + 0x70) = uVar31;
      *(undefined8 *)(pu1_dst + 0x78) = uVar32;
    }
    uVar33 = uVar40 & 0xffffffff;
    pbVar41 = pu1_src + uVar33;
  }
  else {
    uVar33 = uVar40 & 0xffffffff;
    if (nt == 0x20 && strong_intra_smoothing_enable_flag == 1) {
      bVar1 = pu1_src[0x40];
      uVar44 = (uint)bVar1;
      bVar42 = pu1_src[uVar33];
      uVar43 = (uint)bVar42;
      uVar34 = (uint)bVar42 + (uint)bVar1 + (uint)pu1_src[0x60] * -2;
      uVar45 = -uVar34;
      if (0 < (int)uVar34) {
        uVar45 = uVar34;
      }
      bVar2 = *pu1_src;
      uVar35 = (uint)bVar2;
      uVar46 = (uint)bVar2 + (uint)bVar1 + (uint)pu1_src[0x20] * -2;
      uVar34 = -uVar46;
      if (0 < (int)uVar46) {
        uVar34 = uVar46;
      }
      local_138 = bVar2;
      pbVar41 = &local_138 + uVar33;
      *pbVar41 = bVar42;
      if ((7 < uVar34) || (7 < uVar45)) {
        local_138 = bVar2;
        *pbVar41 = bVar42;
        uVar40 = 0x80;
LAB_0014f83e:
        uVar36 = 0;
        auVar48 = pmovsxbw(in_XMM0,0x202020202020202);
        do {
          auVar50 = *(undefined1 (*) [16])(pu1_src + uVar36);
          auVar59 = *(undefined1 (*) [16])(pu1_src + uVar36 + 8);
          auVar68 = pmovzxbw(in_XMM4,auVar50);
          auVar67 = pmovzxbw(auVar50 >> 8,auVar50 >> 8);
          auVar50 = pmovzxbw(auVar50 >> 0x10,auVar50 >> 0x10);
          uVar49 = (ushort)(auVar67._0_2_ * 2 + auVar50._0_2_ + auVar68._0_2_ + auVar48._0_2_) >> 2;
          uVar51 = (ushort)(auVar67._2_2_ * 2 + auVar50._2_2_ + auVar68._2_2_ + auVar48._2_2_) >> 2;
          uVar52 = (ushort)(auVar67._4_2_ * 2 + auVar50._4_2_ + auVar68._4_2_ + auVar48._4_2_) >> 2;
          uVar53 = (ushort)(auVar67._6_2_ * 2 + auVar50._6_2_ + auVar68._6_2_ + auVar48._6_2_) >> 2;
          uVar54 = (ushort)(auVar67._8_2_ * 2 + auVar50._8_2_ + auVar68._8_2_ + auVar48._8_2_) >> 2;
          uVar55 = (ushort)(auVar67._10_2_ * 2 + auVar50._10_2_ + auVar68._10_2_ + auVar48._10_2_)
                   >> 2;
          uVar56 = (ushort)(auVar67._12_2_ * 2 + auVar50._12_2_ + auVar68._12_2_ + auVar48._12_2_)
                   >> 2;
          uVar57 = (ushort)(auVar67._14_2_ * 2 + auVar50._14_2_ + auVar68._14_2_ + auVar48._14_2_)
                   >> 2;
          in_XMM4 = pmovzxbw(auVar68,auVar59);
          auVar50 = pmovzxbw(auVar59 >> 8,auVar59 >> 8);
          auVar59 = pmovzxbw(auVar59 >> 0x10,auVar59 >> 0x10);
          uVar58 = (ushort)(auVar50._0_2_ * 2 + auVar59._0_2_ + in_XMM4._0_2_ + auVar48._0_2_) >> 2;
          uVar60 = (ushort)(auVar50._2_2_ * 2 + auVar59._2_2_ + in_XMM4._2_2_ + auVar48._2_2_) >> 2;
          uVar61 = (ushort)(auVar50._4_2_ * 2 + auVar59._4_2_ + in_XMM4._4_2_ + auVar48._4_2_) >> 2;
          uVar62 = (ushort)(auVar50._6_2_ * 2 + auVar59._6_2_ + in_XMM4._6_2_ + auVar48._6_2_) >> 2;
          uVar63 = (ushort)(auVar50._8_2_ * 2 + auVar59._8_2_ + in_XMM4._8_2_ + auVar48._8_2_) >> 2;
          uVar64 = (ushort)(auVar50._10_2_ * 2 + auVar59._10_2_ + in_XMM4._10_2_ + auVar48._10_2_)
                   >> 2;
          uVar65 = (ushort)(auVar50._12_2_ * 2 + auVar59._12_2_ + in_XMM4._12_2_ + auVar48._12_2_)
                   >> 2;
          uVar66 = (ushort)(auVar50._14_2_ * 2 + auVar59._14_2_ + in_XMM4._14_2_ + auVar48._14_2_)
                   >> 2;
          acStack_136[uVar36 - 1] =
               (uVar49 != 0) * (uVar49 < 0x100) * (char)uVar49 - (0xff < uVar49);
          acStack_136[uVar36] = (uVar51 != 0) * (uVar51 < 0x100) * (char)uVar51 - (0xff < uVar51);
          acStack_136[uVar36 + 1] =
               (uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52);
          acStack_136[uVar36 + 2] =
               (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53);
          acStack_136[uVar36 + 3] =
               (uVar54 != 0) * (uVar54 < 0x100) * (char)uVar54 - (0xff < uVar54);
          acStack_136[uVar36 + 4] =
               (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
          acStack_136[uVar36 + 5] =
               (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
          *(char *)((long)&uStack_130 + uVar36) =
               (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
          *(char *)((long)&uStack_130 + uVar36 + 1) =
               (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
          *(char *)((long)&uStack_130 + uVar36 + 2) =
               (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
          *(char *)((long)&uStack_130 + uVar36 + 3) =
               (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
          *(char *)((long)&uStack_130 + uVar36 + 4) =
               (uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 - (0xff < uVar62);
          *(char *)((long)&uStack_130 + uVar36 + 5) =
               (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
          *(char *)((long)&uStack_130 + uVar36 + 6) =
               (uVar64 != 0) * (uVar64 < 0x100) * (char)uVar64 - (0xff < uVar64);
          *(char *)((long)&uStack_130 + uVar36 + 7) =
               (uVar65 != 0) * (uVar65 < 0x100) * (char)uVar65 - (0xff < uVar65);
          *(char *)((long)&local_128 + uVar36) =
               (uVar66 != 0) * (uVar66 < 0x100) * (char)uVar66 - (0xff < uVar66);
          uVar36 = uVar36 + 0x10;
        } while (uVar36 < uVar33);
        goto LAB_0014f8cf;
      }
      iVar38 = (uint)bVar1 * 0x10;
      local_f8 = bVar1;
      auVar48 = pmovsxbq(in_XMM0,0xf0e);
      auVar50 = pmovsxbq(in_XMM1,0xd0c);
      auVar59 = pmovsxbq(in_XMM2,0xb0a);
      auVar67 = pmovsxbq(in_XMM3,0x908);
      auVar68 = pmovsxbq(in_XMM4,0x706);
      auVar69 = pmovsxbq(in_XMM5,0x504);
      auVar70 = pmovsxbq(in_XMM6,0x302);
      auVar71 = pmovsxbq(in_XMM7,0x100);
      iVar39 = 0;
      lVar37 = 0;
      do {
        auVar72._8_4_ = (int)lVar37;
        auVar72._0_8_ = lVar37;
        auVar72._12_4_ = (int)((ulong)lVar37 >> 0x20);
        auVar75 = (auVar72 | auVar71) ^ _DAT_001721d0;
        lVar74 = auVar75._0_8_;
        auVar77._0_8_ = -(ulong)(lVar74 < -0x7fffffffffffffc1);
        lVar89 = auVar75._8_8_;
        auVar77._8_8_ = -(ulong)(lVar89 < -0x7fffffffffffffc1);
        auVar75 = pshuflw(auVar77,auVar77,0xe8);
        auVar75 = packssdw(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          acStack_136[lVar37 + -1] =
               (char)(((uint)bVar2 * 0x40 - (uint)bVar2) + 0x20 + (uint)bVar1 + iVar39 >> 6);
        }
        auVar76._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar74);
        auVar76._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar89);
        auVar77 = packssdw(auVar76,auVar76);
        auVar75._8_4_ = 0xffffffff;
        auVar75._0_8_ = 0xffffffffffffffff;
        auVar75._12_4_ = 0xffffffff;
        auVar75 = packssdw(auVar77 ^ auVar75,auVar77 ^ auVar75);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          acStack_136[lVar37] =
               (char)((uint)bVar2 * 0x40 + (uint)bVar2 * -2 + 0x20 + (uint)bVar1 * 2 + iVar39 >> 6);
        }
        auVar75 = (auVar72 | auVar70) ^ _DAT_001721d0;
        auVar90._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar75._0_8_);
        auVar90._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar75._8_8_);
        auVar77 = packssdw(auVar90,auVar90);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar77 = packssdw(auVar77 ^ auVar3,auVar77 ^ auVar3);
        auVar77 = packsswb(auVar77,auVar77);
        if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          acStack_136[lVar37 + 1] = (char)(uVar44 * 3 + (uint)bVar2 * 0x3d + 0x20 + iVar39 >> 6);
        }
        auVar91._0_8_ = -(ulong)(auVar75._0_8_ < -0x7fffffffffffffc1);
        auVar91._8_8_ = -(ulong)(auVar75._8_8_ < -0x7fffffffffffffc1);
        auVar75 = pshufhw(auVar75,auVar91,0x84);
        auVar75 = packssdw(auVar75,auVar75);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          acStack_136[lVar37 + 2] =
               (char)((uint)bVar2 * 0x3c + (uint)bVar1 * 4 + 0x20 + iVar39 >> 6);
        }
        auVar75 = (auVar72 | auVar69) ^ _DAT_001721d0;
        lVar74 = auVar75._0_8_;
        auVar92._0_8_ = -(ulong)(lVar74 < -0x7fffffffffffffc1);
        lVar89 = auVar75._8_8_;
        auVar92._8_8_ = -(ulong)(lVar89 < -0x7fffffffffffffc1);
        auVar75 = pshuflw(auVar92,auVar92,0xe8);
        auVar75 = packssdw(auVar75,auVar75);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          acStack_136[lVar37 + 3] = (char)((uint)bVar2 * 0x3b + uVar44 * 5 + 0x20 + iVar39 >> 6);
        }
        auVar78._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar74);
        auVar78._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar89);
        auVar75 = packssdw(auVar78,auVar78);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar75 = packssdw(auVar75 ^ auVar4,auVar75 ^ auVar4);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          acStack_136[lVar37 + 4] =
               (char)((uint)bVar2 * 0x3a + (uint)bVar1 * 6 + 0x20 + iVar39 >> 6);
        }
        auVar75 = (auVar72 | auVar68) ^ _DAT_001721d0;
        auVar93._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar75._0_8_);
        auVar93._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar75._8_8_);
        auVar77 = packssdw(auVar93,auVar93);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar77 = packssdw(auVar77 ^ auVar5,auVar77 ^ auVar5);
        auVar77 = packsswb(auVar77,auVar77);
        if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          acStack_136[lVar37 + 5] =
               (char)((uint)bVar2 * 0x39 + ((uint)bVar1 * 8 - (uint)bVar1) + 0x20 + iVar39 >> 6);
        }
        auVar94._0_8_ = -(ulong)(auVar75._0_8_ < -0x7fffffffffffffc1);
        auVar94._8_8_ = -(ulong)(auVar75._8_8_ < -0x7fffffffffffffc1);
        auVar75 = pshufhw(auVar75,auVar94,0x84);
        auVar75 = packssdw(auVar75,auVar75);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          *(char *)((long)&uStack_130 + lVar37) =
               (char)(uVar35 * 0x38 + (uint)bVar1 * 8 + 0x20 + iVar39 >> 6);
        }
        auVar75 = (auVar72 | auVar67) ^ _DAT_001721d0;
        lVar74 = auVar75._0_8_;
        auVar95._0_8_ = -(ulong)(lVar74 < -0x7fffffffffffffc1);
        lVar89 = auVar75._8_8_;
        auVar95._8_8_ = -(ulong)(lVar89 < -0x7fffffffffffffc1);
        auVar75 = pshuflw(auVar95,auVar95,0xe8);
        auVar75 = packssdw(auVar75,auVar75);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(char *)((long)&uStack_130 + lVar37 + 1) =
               (char)(uVar35 * 0x37 + uVar44 * 9 + 0x20 + iVar39 >> 6);
        }
        auVar79._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar74);
        auVar79._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar89);
        auVar75 = packssdw(auVar79,auVar79);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar75 = packssdw(auVar75 ^ auVar6,auVar75 ^ auVar6);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          *(char *)((long)&uStack_130 + lVar37 + 2) =
               (char)(uVar35 * 0x36 + uVar44 * 10 + 0x20 + iVar39 >> 6);
        }
        auVar75 = (auVar72 | auVar59) ^ _DAT_001721d0;
        auVar96._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar75._0_8_);
        auVar96._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar75._8_8_);
        auVar77 = packssdw(auVar96,auVar96);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar77 = packssdw(auVar77 ^ auVar7,auVar77 ^ auVar7);
        auVar77 = packsswb(auVar77,auVar77);
        if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(char *)((long)&uStack_130 + lVar37 + 3) =
               (char)(uVar35 * 0x35 + uVar44 * 0xb + 0x20 + iVar39 >> 6);
        }
        auVar97._0_8_ = -(ulong)(auVar75._0_8_ < -0x7fffffffffffffc1);
        auVar97._8_8_ = -(ulong)(auVar75._8_8_ < -0x7fffffffffffffc1);
        auVar75 = pshufhw(auVar75,auVar97,0x84);
        auVar75 = packssdw(auVar75,auVar75);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          *(char *)((long)&uStack_130 + lVar37 + 4) =
               (char)(uVar35 * 0x34 + uVar44 * 0xc + 0x20 + iVar39 >> 6);
        }
        auVar75 = (auVar72 | auVar50) ^ _DAT_001721d0;
        lVar74 = auVar75._0_8_;
        auVar98._0_8_ = -(ulong)(lVar74 < -0x7fffffffffffffc1);
        lVar89 = auVar75._8_8_;
        auVar98._8_8_ = -(ulong)(lVar89 < -0x7fffffffffffffc1);
        auVar75 = pshuflw(auVar98,auVar98,0xe8);
        auVar75 = packssdw(auVar75,auVar75);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(char *)((long)&uStack_130 + lVar37 + 5) =
               (char)(uVar35 * 0x33 + uVar44 * 0xd + 0x20 + iVar39 >> 6);
        }
        auVar80._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar74);
        auVar80._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar89);
        auVar75 = packssdw(auVar80,auVar80);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar75 = packssdw(auVar75 ^ auVar8,auVar75 ^ auVar8);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          *(char *)((long)&uStack_130 + lVar37 + 6) =
               (char)(iVar38 + uVar44 * -2 + uVar35 * 0x32 + 0x20 + iVar39 >> 6);
        }
        auVar72 = (auVar72 | auVar48) ^ _DAT_001721d0;
        auVar81._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar72._0_8_);
        auVar81._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar72._8_8_);
        auVar75 = packssdw(auVar81,auVar81);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar75 = packssdw(auVar75 ^ auVar9,auVar75 ^ auVar9);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(char *)((long)&uStack_130 + lVar37 + 7) =
               (char)(uVar35 * 0x31 + uVar44 * 0xf + 0x20 + iVar39 >> 6);
        }
        auVar82._0_8_ = -(ulong)(auVar72._0_8_ < -0x7fffffffffffffc1);
        auVar82._8_8_ = -(ulong)(auVar72._8_8_ < -0x7fffffffffffffc1);
        auVar72 = pshufhw(auVar72,auVar82,0x84);
        auVar72 = packssdw(auVar72,auVar72);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          *(char *)((long)&local_128 + lVar37) =
               (char)((uint)bVar2 * 0x30 + iVar38 + 0x20 + iVar39 >> 6);
        }
        lVar37 = lVar37 + 0x10;
        iVar39 = iVar39 + iVar38 + (uint)bVar2 * -0x10;
      } while (lVar37 != 0x40);
      iVar38 = (uint)bVar42 * 0x10;
      iVar39 = (uint)bVar42 * 0xc;
      iVar47 = 0;
      uVar40 = 0;
      do {
        auVar73._8_4_ = (int)uVar40;
        auVar73._0_8_ = uVar40;
        auVar73._12_4_ = (int)(uVar40 >> 0x20);
        auVar72 = (auVar73 | auVar71) ^ _DAT_001721d0;
        lVar37 = auVar72._0_8_;
        auVar99._0_8_ = -(ulong)(lVar37 < -0x7fffffffffffffc1);
        lVar74 = auVar72._8_8_;
        auVar99._8_8_ = -(ulong)(lVar74 < -0x7fffffffffffffc1);
        auVar72 = pshuflw(auVar99,auVar99,0xe8);
        auVar72 = packssdw(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x41] =
               (byte)((uint)bVar42 + ((uint)bVar1 * 0x40 - (uint)bVar1) + 0x20 + iVar47 >> 6);
        }
        auVar83._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar37);
        auVar83._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar74);
        auVar72 = packssdw(auVar83,auVar83);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar72 = packssdw(auVar72 ^ auVar10,auVar72 ^ auVar10);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x42] =
               (byte)((uint)bVar1 * 0x40 + uVar44 * -2 + (uint)bVar42 * 2 + 0x20 + iVar47 >> 6);
        }
        auVar72 = (auVar73 | auVar70) ^ _DAT_001721d0;
        auVar100._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar72._0_8_);
        auVar100._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar72._8_8_);
        auVar75 = packssdw(auVar100,auVar100);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar75 = packssdw(auVar75 ^ auVar11,auVar75 ^ auVar11);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x43] =
               (byte)((uint)bVar42 * 3 + (uint)bVar1 * 0x3d + 0x20 + iVar47 >> 6);
        }
        auVar101._0_8_ = -(ulong)(auVar72._0_8_ < -0x7fffffffffffffc1);
        auVar101._8_8_ = -(ulong)(auVar72._8_8_ < -0x7fffffffffffffc1);
        auVar72 = pshufhw(auVar72,auVar101,0x84);
        auVar72 = packssdw(auVar72,auVar72);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x44] =
               (byte)((uint)bVar1 * 0x3c + (uint)bVar42 * 4 + 0x20 + iVar47 >> 6);
        }
        auVar72 = (auVar73 | auVar69) ^ _DAT_001721d0;
        lVar37 = auVar72._0_8_;
        auVar102._0_8_ = -(ulong)(lVar37 < -0x7fffffffffffffc1);
        lVar74 = auVar72._8_8_;
        auVar102._8_8_ = -(ulong)(lVar74 < -0x7fffffffffffffc1);
        auVar72 = pshuflw(auVar102,auVar102,0xe8);
        auVar72 = packssdw(auVar72,auVar72);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x45] = (byte)(uVar43 * 5 + (uint)bVar1 * 0x3b + 0x20 + iVar47 >> 6)
          ;
        }
        auVar84._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar37);
        auVar84._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar74);
        auVar72 = packssdw(auVar84,auVar84);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar72 = packssdw(auVar72 ^ auVar12,auVar72 ^ auVar12);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x46] =
               (byte)((uint)bVar1 * 0x3a + (uint)bVar42 * 6 + 0x20 + iVar47 >> 6);
        }
        auVar72 = (auVar73 | auVar68) ^ _DAT_001721d0;
        auVar103._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar72._0_8_);
        auVar103._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar72._8_8_);
        auVar75 = packssdw(auVar103,auVar103);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar75 = packssdw(auVar75 ^ auVar13,auVar75 ^ auVar13);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x47] =
               (byte)(((uint)bVar42 * 8 - (uint)bVar42) + (uint)bVar1 * 0x39 + 0x20 + iVar47 >> 6);
        }
        auVar104._0_8_ = -(ulong)(auVar72._0_8_ < -0x7fffffffffffffc1);
        auVar104._8_8_ = -(ulong)(auVar72._8_8_ < -0x7fffffffffffffc1);
        auVar72 = pshufhw(auVar72,auVar104,0x84);
        auVar72 = packssdw(auVar72,auVar72);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x48] =
               (byte)((uint)bVar1 * 0x38 + (uint)bVar42 * 8 + 0x20 + iVar47 >> 6);
        }
        auVar72 = (auVar73 | auVar67) ^ _DAT_001721d0;
        lVar37 = auVar72._0_8_;
        auVar105._0_8_ = -(ulong)(lVar37 < -0x7fffffffffffffc1);
        lVar74 = auVar72._8_8_;
        auVar105._8_8_ = -(ulong)(lVar74 < -0x7fffffffffffffc1);
        auVar72 = pshuflw(auVar105,auVar105,0xe8);
        auVar72 = packssdw(auVar72,auVar72);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x49] = (byte)(iVar47 + uVar44 * 0x37 + uVar43 * 9 + 0x20 >> 6);
        }
        auVar85._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar37);
        auVar85._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar74);
        auVar72 = packssdw(auVar85,auVar85);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        auVar72 = packssdw(auVar72 ^ auVar14,auVar72 ^ auVar14);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x4a] = (byte)(iVar47 + uVar44 * 0x36 + uVar43 * 10 + 0x20 >> 6);
        }
        auVar72 = (auVar73 | auVar59) ^ _DAT_001721d0;
        auVar106._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar72._0_8_);
        auVar106._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar72._8_8_);
        auVar75 = packssdw(auVar106,auVar106);
        auVar15._8_4_ = 0xffffffff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15._12_4_ = 0xffffffff;
        auVar75 = packssdw(auVar75 ^ auVar15,auVar75 ^ auVar15);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x4b] = (byte)(iVar47 + uVar44 * 0x35 + uVar43 * 0xb + 0x20 >> 6);
        }
        auVar107._0_8_ = -(ulong)(auVar72._0_8_ < -0x7fffffffffffffc1);
        auVar107._8_8_ = -(ulong)(auVar72._8_8_ < -0x7fffffffffffffc1);
        auVar72 = pshufhw(auVar72,auVar107,0x84);
        auVar72 = packssdw(auVar72,auVar72);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x4c] = (byte)(iVar47 + uVar44 * 0x34 + iVar39 + 0x20 >> 6);
        }
        auVar72 = (auVar73 | auVar50) ^ _DAT_001721d0;
        lVar37 = auVar72._0_8_;
        auVar108._0_8_ = -(ulong)(lVar37 < -0x7fffffffffffffc1);
        lVar74 = auVar72._8_8_;
        auVar108._8_8_ = -(ulong)(lVar74 < -0x7fffffffffffffc1);
        auVar72 = pshuflw(auVar108,auVar108,0xe8);
        auVar72 = packssdw(auVar72,auVar72);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x4d] = (byte)(iVar47 + uVar44 * 0x33 + iVar39 + uVar43 + 0x20 >> 6)
          ;
        }
        auVar86._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar37);
        auVar86._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar74);
        auVar72 = packssdw(auVar86,auVar86);
        auVar16._8_4_ = 0xffffffff;
        auVar16._0_8_ = 0xffffffffffffffff;
        auVar16._12_4_ = 0xffffffff;
        auVar72 = packssdw(auVar72 ^ auVar16,auVar72 ^ auVar16);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x4e] =
               (byte)(iVar47 + iVar38 + uVar43 * -2 + uVar44 * 0x32 + 0x20 >> 6);
        }
        auVar72 = (auVar73 | auVar48) ^ _DAT_001721d0;
        auVar87._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar72._0_8_);
        auVar87._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar72._8_8_);
        auVar75 = packssdw(auVar87,auVar87);
        auVar17._8_4_ = 0xffffffff;
        auVar17._0_8_ = 0xffffffffffffffff;
        auVar17._12_4_ = 0xffffffff;
        auVar75 = packssdw(auVar75 ^ auVar17,auVar75 ^ auVar17);
        auVar75 = packsswb(auVar75,auVar75);
        if ((auVar75 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          (&local_138)[uVar40 | 0x4f] = (byte)(iVar47 + uVar44 * 0x31 + uVar43 * 0xf + 0x20 >> 6);
        }
        auVar88._0_8_ = -(ulong)(auVar72._0_8_ < -0x7fffffffffffffc1);
        auVar88._8_8_ = -(ulong)(auVar72._8_8_ < -0x7fffffffffffffc1);
        auVar72 = pshufhw(auVar72,auVar88,0x84);
        auVar72 = packssdw(auVar72,auVar72);
        auVar72 = packsswb(auVar72,auVar72);
        if ((auVar72 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          *(char *)((long)&local_e8 + uVar40) = (char)(iVar47 + uVar44 * 0x30 + iVar38 + 0x20 >> 6);
        }
        uVar40 = uVar40 + 0x10;
        iVar47 = iVar47 + iVar38 + (uint)bVar1 * -0x10;
      } while (uVar40 != 0x40);
    }
    else {
      bVar42 = pu1_src[uVar40];
      pbVar41 = &local_138 + uVar40;
      local_138 = *pu1_src;
      *pbVar41 = bVar42;
      if (0 < nt) goto LAB_0014f83e;
LAB_0014f8cf:
      uVar33 = uVar40;
      *pbVar41 = bVar42;
    }
    if (nt == 0x10) {
      *(ulong *)pu1_dst = CONCAT71(_uStack_137,local_138);
      *(undefined8 *)(pu1_dst + 8) = uStack_130;
      *(undefined8 *)(pu1_dst + 0x10) = local_128;
      *(undefined8 *)(pu1_dst + 0x18) = uStack_120;
      *(undefined8 *)(pu1_dst + 0x20) = local_118;
      *(undefined8 *)(pu1_dst + 0x28) = uStack_110;
      *(undefined8 *)(pu1_dst + 0x30) = local_108;
      *(undefined8 *)(pu1_dst + 0x38) = uStack_100;
    }
    else if (nt == 8) {
      *(ulong *)pu1_dst = CONCAT71(_uStack_137,local_138);
      *(undefined8 *)(pu1_dst + 8) = uStack_130;
      *(undefined8 *)(pu1_dst + 0x10) = local_128;
      *(undefined8 *)(pu1_dst + 0x18) = uStack_120;
    }
    else if (nt == 4) {
      *(ulong *)pu1_dst = CONCAT71(_uStack_137,local_138);
      *(undefined8 *)(pu1_dst + 8) = uStack_130;
    }
    else {
      if (nt != 0x20) {
        return;
      }
      *(ulong *)pu1_dst = CONCAT71(_uStack_137,local_138);
      *(undefined8 *)(pu1_dst + 8) = uStack_130;
      *(undefined8 *)(pu1_dst + 0x10) = local_128;
      *(undefined8 *)(pu1_dst + 0x18) = uStack_120;
      *(undefined8 *)(pu1_dst + 0x20) = local_118;
      *(undefined8 *)(pu1_dst + 0x28) = uStack_110;
      *(undefined8 *)(pu1_dst + 0x30) = local_108;
      *(undefined8 *)(pu1_dst + 0x38) = uStack_100;
      *(ulong *)(pu1_dst + 0x40) = CONCAT71(uStack_f7,local_f8);
      *(undefined8 *)(pu1_dst + 0x48) = uStack_f0;
      *(undefined8 *)(pu1_dst + 0x50) = local_e8;
      *(undefined8 *)(pu1_dst + 0x58) = uStack_e0;
      *(undefined8 *)(pu1_dst + 0x60) = local_d8;
      *(undefined8 *)(pu1_dst + 0x68) = uStack_d0;
      *(undefined8 *)(pu1_dst + 0x70) = local_c8;
      *(undefined8 *)(pu1_dst + 0x78) = uStack_c0;
    }
  }
  pu1_dst[uVar33] = *pbVar41;
switchD_0014f804_caseD_2:
  return;
}

Assistant:

void ihevc_intra_pred_ref_filtering_sse42(UWORD8 *pu1_src,
                                          WORD32 nt,
                                          UWORD8 *pu1_dst,
                                          WORD32 mode,
                                          WORD32 strong_intra_smoothing_enable_flag)
{
    WORD32 filter_flag;
    WORD32 i; /* Generic indexing variable */
    WORD32 four_nt = 4 * nt;
    UWORD8 au1_flt[(4 * MAX_CU_SIZE) + 1];
    WORD32 bi_linear_int_flag = 0;
    WORD32 abs_cond_left_flag = 0;
    WORD32 abs_cond_top_flag = 0;
    WORD32 dc_val = 1 << (BIT_DEPTH - 5);
    __m128i src_temp1, src_temp2, src_temp3, src_temp7;
    __m128i src_temp4, src_temp5, src_temp6, src_temp8;

    //WORD32 strong_intra_smoothing_enable_flag  = 1;



    filter_flag = gau1_intra_pred_ref_filter[mode] & (1 << (CTZ(nt) - 2));
    if(0 == filter_flag)
    {
        if(pu1_src == pu1_dst)
        {
            return;
        }
        else
        {
            if(nt == 4)
            {
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                pu1_dst[four_nt] = pu1_src[four_nt];

            }

            else if(nt == 8)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);


                pu1_dst[four_nt] = pu1_src[four_nt];
            }
            else if(nt == 16)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_src + 32));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 48));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

                pu1_dst[four_nt] = pu1_src[four_nt];
            }
            else if(nt == 32)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_src + 32));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 48));

                src_temp5 = _mm_loadu_si128((__m128i *)(pu1_src + 64));
                src_temp6 = _mm_loadu_si128((__m128i *)(pu1_src + 80));
                src_temp7 = _mm_loadu_si128((__m128i *)(pu1_src + 96));
                src_temp8 = _mm_loadu_si128((__m128i *)(pu1_src + 112));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

                _mm_storeu_si128((__m128i *)(pu1_dst + 64), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 80), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 96), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 112), src_temp8);

                pu1_dst[four_nt] = pu1_src[four_nt];
            }

        }
    }

    else
    {
        /* If strong intra smoothin is enabled and transform size is 32 */
        if((1 == strong_intra_smoothing_enable_flag) && (32 == nt))
        {
            /* Strong Intra Filtering */
            abs_cond_top_flag = (abs(pu1_src[2 * nt] + pu1_src[4 * nt]
                                     - (2 * pu1_src[3 * nt]))) < dc_val;
            abs_cond_left_flag = (abs(pu1_src[2 * nt] + pu1_src[0]
                                      - (2 * pu1_src[nt]))) < dc_val;

            bi_linear_int_flag = ((1 == abs_cond_left_flag)
                            && (1 == abs_cond_top_flag));
        }
        /* Extremities Untouched*/
        au1_flt[0] = pu1_src[0];
        au1_flt[4 * nt] = pu1_src[4 * nt];

        /* Strong filtering of reference samples */
        if(1 == bi_linear_int_flag)
        {
            au1_flt[2 * nt] = pu1_src[2 * nt];

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i] = (((2 * nt) - i) * pu1_src[0] + i * pu1_src[2 * nt] + 32) >> 6;

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i + (2 * nt)] = (((2 * nt) - i) * pu1_src[2 * nt] + i * pu1_src[4 * nt] + 32) >> 6;
        }
        else
        {
            __m128i const_value_8x16;

            const_value_8x16 = _mm_set1_epi16(2);

            au1_flt[0] = pu1_src[0];
            au1_flt[4 * nt] = pu1_src[4 * nt];

            /* Perform bilinear filtering of Reference Samples */
            for(i = 0; i < (four_nt); i += 16)
            {
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src + i));
                src_temp2 = _mm_srli_si128(src_temp1, 1);
                src_temp3 = _mm_srli_si128(src_temp2, 1);

                src_temp1 =  _mm_cvtepu8_epi16(src_temp1);
                src_temp2 =  _mm_cvtepu8_epi16(src_temp2);
                src_temp3 =  _mm_cvtepu8_epi16(src_temp3);

                src_temp2 = _mm_slli_epi16(src_temp2,  1);

                src_temp1 = _mm_add_epi16(src_temp1, src_temp2);
                src_temp1 = _mm_add_epi16(src_temp1, src_temp3);
                src_temp1 = _mm_add_epi16(src_temp1, const_value_8x16);

                src_temp1 = _mm_srai_epi16(src_temp1,  2);

                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 8 + i));
                src_temp5 = _mm_srli_si128(src_temp4, 1);
                src_temp6 = _mm_srli_si128(src_temp5, 1);

                src_temp4 =  _mm_cvtepu8_epi16(src_temp4);
                src_temp5 =  _mm_cvtepu8_epi16(src_temp5);
                src_temp6 =  _mm_cvtepu8_epi16(src_temp6);

                src_temp5 = _mm_slli_epi16(src_temp5,  1);

                src_temp4 = _mm_add_epi16(src_temp4, src_temp5);
                src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
                src_temp4 = _mm_add_epi16(src_temp4, const_value_8x16);

                src_temp4 = _mm_srai_epi16(src_temp4,  2);

                /* converting 16 bit to 8 bit */
                src_temp1 = _mm_packus_epi16(src_temp1, src_temp4);

                _mm_storeu_si128((__m128i *)(au1_flt + 1 + i), src_temp1);
            }
            au1_flt[4 * nt] = pu1_src[4 * nt];
        }

        if(nt == 4)
        {
            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            pu1_dst[four_nt] = au1_flt[four_nt];
        }
        else if(nt == 8)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }
        else if(nt == 16)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));
            src_temp3 = _mm_loadu_si128((__m128i *)(au1_flt + 32));
            src_temp4 = _mm_loadu_si128((__m128i *)(au1_flt + 48));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }

        else if(nt == 32)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));
            src_temp3 = _mm_loadu_si128((__m128i *)(au1_flt + 32));
            src_temp4 = _mm_loadu_si128((__m128i *)(au1_flt + 48));

            src_temp5 = _mm_loadu_si128((__m128i *)(au1_flt + 64));
            src_temp6 = _mm_loadu_si128((__m128i *)(au1_flt + 80));
            src_temp7 = _mm_loadu_si128((__m128i *)(au1_flt + 96));
            src_temp8 = _mm_loadu_si128((__m128i *)(au1_flt + 112));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

            _mm_storeu_si128((__m128i *)(pu1_dst + 64), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + 80), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + 96), src_temp7);
            _mm_storeu_si128((__m128i *)(pu1_dst + 112), src_temp8);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }

    }
}